

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int gen_publickey_from_ecdsa_openssh_priv_data
              (LIBSSH2_SESSION *session,libssh2_curve_type curve_type,string_buf *decrypted,
              uchar **method,size_t *method_len,uchar **pubkeydata,size_t *pubkeydata_len,
              EC_KEY **ec_ctx)

{
  int iVar1;
  BIGNUM *ret;
  EVP_PKEY *pkey;
  EVP_PKEY *pk;
  BIGNUM *bn_exponent;
  EC_KEY *ec_key;
  uchar *point_buf;
  uchar *exponent;
  uchar *curve;
  size_t pointlen;
  size_t exponentlen;
  size_t curvelen;
  uchar **ppuStack_40;
  int rc;
  uchar **pubkeydata_local;
  size_t *method_len_local;
  uchar **method_local;
  string_buf *decrypted_local;
  LIBSSH2_SESSION *pLStack_18;
  libssh2_curve_type curve_type_local;
  LIBSSH2_SESSION *session_local;
  
  curvelen._4_4_ = 0;
  bn_exponent = (BIGNUM *)0x0;
  ppuStack_40 = pubkeydata;
  pubkeydata_local = (uchar **)method_len;
  method_len_local = (size_t *)method;
  method_local = &decrypted->data;
  decrypted_local._4_4_ = curve_type;
  pLStack_18 = session;
  iVar1 = _libssh2_get_string(decrypted,&exponent,&exponentlen);
  if ((iVar1 == 0) && (exponentlen != 0)) {
    iVar1 = _libssh2_get_string((string_buf *)method_local,(uchar **)&ec_key,(size_t *)&curve);
    if (iVar1 == 0) {
      iVar1 = _libssh2_get_bignum_bytes((string_buf *)method_local,&point_buf,&pointlen);
      if (iVar1 == 0) {
        curvelen._4_4_ =
             _libssh2_ecdsa_curve_name_with_octal_new
                       ((EC_KEY **)&bn_exponent,(uchar *)ec_key,(size_t)curve,decrypted_local._4_4_)
        ;
        if (curvelen._4_4_ == 0) {
          ret = BN_new();
          if (ret != (BIGNUM *)0x0) {
            BN_bin2bn(point_buf,(int)pointlen,ret);
            iVar1 = EC_KEY_set_private_key((EC_KEY *)bn_exponent,ret);
            curvelen._4_4_ = (uint)(iVar1 != 1);
            if ((((curvelen._4_4_ == 0) && (bn_exponent != (BIGNUM *)0x0)) &&
                (ppuStack_40 != (uchar **)0x0)) && (method_len_local != (size_t *)0x0)) {
              pkey = EVP_PKEY_new();
              EVP_PKEY_set1_EC_KEY(pkey,(ec_key_st *)bn_exponent);
              curvelen._4_4_ =
                   gen_publickey_from_ec_evp
                             (pLStack_18,(uchar **)method_len_local,(size_t *)pubkeydata_local,
                              ppuStack_40,pubkeydata_len,0,(EVP_PKEY *)pkey);
              if (pkey != (EVP_PKEY *)0x0) {
                EVP_PKEY_free(pkey);
              }
            }
            if (ec_ctx == (EC_KEY **)0x0) {
              EC_KEY_free((EC_KEY *)bn_exponent);
            }
            else {
              *ec_ctx = (EC_KEY *)bn_exponent;
            }
            return curvelen._4_4_;
          }
          curvelen._4_4_ = -1;
          _libssh2_error(pLStack_18,-6,"Unable to allocate memory for private key data");
        }
        else {
          curvelen._4_4_ = -1;
          _libssh2_error(pLStack_18,-0xe,"ECDSA could not create key");
        }
        if (bn_exponent != (BIGNUM *)0x0) {
          EC_KEY_free((EC_KEY *)bn_exponent);
        }
        session_local._4_4_ = curvelen._4_4_;
      }
      else {
        _libssh2_error(pLStack_18,-0xe,"ECDSA no exponent");
        session_local._4_4_ = -1;
      }
    }
    else {
      _libssh2_error(pLStack_18,-0xe,"ECDSA no point");
      session_local._4_4_ = -1;
    }
  }
  else {
    _libssh2_error(pLStack_18,-0xe,"ECDSA no curve");
    session_local._4_4_ = -1;
  }
  return session_local._4_4_;
}

Assistant:

static int
gen_publickey_from_ecdsa_openssh_priv_data(LIBSSH2_SESSION *session,
                                           libssh2_curve_type curve_type,
                                           struct string_buf *decrypted,
                                           unsigned char **method,
                                           size_t *method_len,
                                           unsigned char **pubkeydata,
                                           size_t *pubkeydata_len,
                                           libssh2_ecdsa_ctx **ec_ctx)
{
    int rc = 0;
    size_t curvelen, exponentlen, pointlen;
    unsigned char *curve, *exponent, *point_buf;
    EC_KEY *ec_key = NULL;
    BIGNUM *bn_exponent;

    _libssh2_debug((session,
                   LIBSSH2_TRACE_AUTH,
                   "Computing ECDSA keys from private key data"));

    if(_libssh2_get_string(decrypted, &curve, &curvelen) ||
        curvelen == 0) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "ECDSA no curve");
        return -1;
    }

    if(_libssh2_get_string(decrypted, &point_buf, &pointlen)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "ECDSA no point");
        return -1;
    }

    if(_libssh2_get_bignum_bytes(decrypted, &exponent, &exponentlen)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "ECDSA no exponent");
        return -1;
    }

    rc = _libssh2_ecdsa_curve_name_with_octal_new(&ec_key,
                                                  point_buf, pointlen,
                                                  curve_type);
    if(rc) {
        rc = -1;
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "ECDSA could not create key");
        goto fail;
    }

    bn_exponent = BN_new();
    if(!bn_exponent) {
        rc = -1;
        _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                       "Unable to allocate memory for private key data");
        goto fail;
    }

    BN_bin2bn(exponent, (int) exponentlen, bn_exponent);
    rc = (EC_KEY_set_private_key(ec_key, bn_exponent) != 1);

    if(rc == 0 && ec_key && pubkeydata && method) {
        EVP_PKEY *pk = EVP_PKEY_new();
        EVP_PKEY_set1_EC_KEY(pk, ec_key);

        rc = gen_publickey_from_ec_evp(session, method, method_len,
                                       pubkeydata, pubkeydata_len,
                                       0, pk);

        if(pk)
            EVP_PKEY_free(pk);
    }

    if(ec_ctx)
        *ec_ctx = ec_key;
    else
        EC_KEY_free(ec_key);

    return rc;

fail:
    if(ec_key)
        EC_KEY_free(ec_key);

    return rc;
}